

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::java::ExtraBuilderInterfaces_abi_cxx11_
          (string *__return_storage_ptr__,java *this,Descriptor *descriptor)

{
  AlphaNum *in_R8;
  AlphaNum local_b8;
  string_view local_88;
  AlphaNum local_78;
  AlphaNum local_48;
  Descriptor *local_18;
  Descriptor *descriptor_local;
  
  local_18 = (Descriptor *)this;
  descriptor_local = (Descriptor *)__return_storage_ptr__;
  absl::lts_20250127::AlphaNum::AlphaNum
            (&local_48,"// @@protoc_insertion_point(builder_implements:");
  local_88 = Descriptor::full_name(local_18);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_78,local_88);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_b8,")");
  absl::lts_20250127::StrCat_abi_cxx11_
            (__return_storage_ptr__,(lts_20250127 *)&local_48,&local_78,&local_b8,in_R8);
  return __return_storage_ptr__;
}

Assistant:

std::string ExtraBuilderInterfaces(const Descriptor* descriptor) {
  return absl::StrCat("// @@protoc_insertion_point(builder_implements:",
                      descriptor->full_name(), ")");
}